

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
* __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
::_adjRemoveRefs(Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
                 *this,size_t level,
                Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
                *pNode)

{
  Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
  *pNVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t *psVar7;
  pointer pNVar8;
  pointer pNVar9;
  pointer pNVar10;
  ulong uVar11;
  
  uVar4 = (pNode->_nodeRefs)._swapLevel;
  uVar11 = (level < uVar4) + level;
  if (uVar4 < (ulong)((long)(pNode->_nodeRefs)._nodes.
                            super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pNode->_nodeRefs)._nodes.
                            super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    pNVar8 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar9 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((uVar11 < (ulong)((long)pNVar9 - (long)pNVar8 >> 4)) &&
       (pNVar10 = (pNode->_nodeRefs)._nodes.
                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       uVar4 < (ulong)((long)(pNode->_nodeRefs)._nodes.
                             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar10 >> 4))) {
      uVar5 = uVar11 * 0x10 | 8;
      uVar11 = (level < uVar4) + level;
      do {
        uVar11 = uVar11 + 1;
        *(long *)((long)&pNVar10->pNode + uVar5) =
             *(long *)((long)&pNVar8->pNode + uVar5) + *(long *)((long)&pNVar10->pNode + uVar5) + -1
        ;
        pNVar1 = pNVar8[uVar4].pNode;
        sVar2 = pNVar8[uVar4].width;
        sVar3 = pNVar10[uVar4].width;
        pNVar8[uVar4].pNode = pNVar10[uVar4].pNode;
        pNVar8[uVar4].width = sVar3;
        pNVar8 = (pNode->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (pNode->_nodeRefs)._swapLevel;
        pNVar8->pNode = pNVar1;
        pNVar8->width = sVar2;
        uVar4 = (pNode->_nodeRefs)._swapLevel + 1;
        (pNode->_nodeRefs)._swapLevel = uVar4;
        pNVar8 = (this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar9 = (this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)pNVar9 - (long)pNVar8 >> 4) <= uVar11) break;
        pNVar10 = (pNode->_nodeRefs)._nodes.
                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = uVar5 + 0x10;
      } while (uVar4 < (ulong)((long)(pNode->_nodeRefs)._nodes.
                                     super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar10 >> 4
                              ));
    }
  }
  else {
    pNVar8 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar9 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar5 = (long)pNVar9 - (long)pNVar8 >> 4;
  lVar6 = uVar5 - uVar11;
  if (uVar11 <= uVar5 && lVar6 != 0) {
    psVar7 = &pNVar8[uVar11].width;
    do {
      *psVar7 = *psVar7 - 1;
      psVar7 = psVar7 + 2;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    (pNode->_nodeRefs)._swapLevel = (uVar4 + uVar5) - uVar11;
  }
  return pNode;
}

Assistant:

Node<T, _Compare> *Node<T, _Compare>::_adjRemoveRefs(size_t level, Node<T, _Compare> *pNode) {
    assert(pNode);
    SwappableNodeRefStack<T, _Compare> &thatRefs = pNode->_nodeRefs;

    assert(pNode != this);
    if (level < thatRefs.swapLevel()) {
        assert(level == thatRefs.swapLevel() - 1);
        ++level;
    }
    if (thatRefs.canSwap()) {
        assert(level == thatRefs.swapLevel());
        while (level < _nodeRefs.height() && thatRefs.canSwap()) {
            assert(level == thatRefs.swapLevel());
            // Compute the new width for the new node
            thatRefs[level].width += _nodeRefs[level].width - 1;
            thatRefs.swap(_nodeRefs);
            ++level;
        }
        assert(thatRefs.canSwap() || thatRefs.allNodePointerMatch(pNode));
    }
    // Decrement my widths as my refs are over the top of the missing pNode.
    while (level < _nodeRefs.height()) {
        _nodeRefs[level].width -= 1;
        ++level;
        thatRefs.incSwapLevel();
    }
    assert(! _nodeRefs.canSwap());
    return pNode;
}